

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_> *
libcellml::unitsUsed
          (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           *__return_storage_ptr__,ModelPtr *model,ComponentConstPtr *component)

{
  pointer *this;
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  string *psVar4;
  element_type *peVar5;
  iterator iVar6;
  iterator iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ComponentConstPtr *component_00;
  shared_ptr<libcellml::Units> *local_240;
  bool local_229;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_1f0;
  const_iterator local_1e8;
  shared_ptr<const_libcellml::Component> local_1e0;
  undefined1 local_1d0 [8];
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  childUsedUnits;
  ComponentPtr childComponent;
  size_t i_1;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_188;
  const_iterator local_180;
  undefined1 local_178 [8];
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  requiredUnits_1;
  UnitsPtr u_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unitsName;
  iterator __end1;
  iterator __begin1;
  NameList *__range1;
  NameList componentCnUnitsNames;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_f0;
  const_iterator local_e8;
  undefined1 local_e0 [8];
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  requiredUnits;
  UnitsPtr availableUnits;
  undefined1 local_98 [8];
  UnitsPtr modelUnits;
  undefined1 local_60 [8];
  UnitsPtr u;
  VariablePtr v;
  ulong local_30;
  size_t i;
  ComponentConstPtr *component_local;
  ModelPtr *model_local;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *usedUnits;
  
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  vector(__return_storage_ptr__);
  local_30 = 0;
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
    sVar3 = Component::variableCount(peVar2);
    if (sVar3 <= local_30) break;
    peVar2 = std::
             __shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
    Component::variable((Component *)
                        &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(size_t)peVar2);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Variable::units((Variable *)local_60);
    bVar1 = std::operator!=((shared_ptr<libcellml::Units> *)local_60,(nullptr_t)0x0);
    modelUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _7_1_ = 0;
    local_229 = false;
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      NamedEntity::name_abi_cxx11_((string *)&stack0xffffffffffffff80,&peVar5->super_NamedEntity);
      modelUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = 1;
      bVar1 = isStandardUnitName((string *)&stack0xffffffffffffff80);
      local_229 = false;
      if (!bVar1) {
        local_229 = std::operator!=(model,(nullptr_t)0x0);
      }
    }
    if ((modelUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
    if (local_229 == false) {
      bVar1 = std::operator==(model,(nullptr_t)0x0);
      if (bVar1) {
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_60);
      }
    }
    else {
      psVar4 = (string *)
               std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
      peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
      NamedEntity::name_abi_cxx11_
                ((string *)
                 &availableUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&peVar5->super_NamedEntity);
      Model::units((Model *)local_98,psVar4);
      std::__cxx11::string::~string
                ((string *)
                 &availableUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
      if (bVar1) {
        local_240 = (shared_ptr<libcellml::Units> *)local_98;
      }
      else {
        local_240 = (shared_ptr<libcellml::Units> *)local_60;
      }
      this = &requiredUnits.
              super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::shared_ptr<libcellml::Units>::shared_ptr((shared_ptr<libcellml::Units> *)this,local_240);
      referencedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)local_e0,model,(UnitsPtr *)this);
      local_f0._M_current =
           (shared_ptr<libcellml::Units> *)
           std::
           vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ::end(__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
      ::__normal_iterator<std::shared_ptr<libcellml::Units>*>
                ((__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
                  *)&local_e8,&local_f0);
      iVar6 = std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)local_e0);
      iVar7 = std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     *)local_e0);
      componentCnUnitsNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                    ::
                    insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,void>
                              ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                                *)__return_storage_ptr__,local_e8,
                               (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                                )iVar6._M_current,
                               (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                                )iVar7._M_current);
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::push_back(__return_storage_ptr__,
                  (value_type *)
                  &requiredUnits.
                   super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                 *)local_e0);
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)
                 &requiredUnits.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_98);
    }
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_60);
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)
               &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    local_30 = local_30 + 1;
  }
  findComponentCnUnitsNames_abi_cxx11_((NameList *)&__range1,(libcellml *)component,component_00);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  unitsName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&unitsName), bVar1) {
    u_1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    psVar4 = (string *)
             std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    Model::units((Model *)&stack0xfffffffffffffeb0,psVar4);
    bVar1 = std::operator==((shared_ptr<libcellml::Units> *)&stack0xfffffffffffffeb0,(nullptr_t)0x0)
    ;
    if (bVar1) {
      Units::create((Units *)&requiredUnits_1.
                              super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (string *)
                    u_1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi);
      std::shared_ptr<libcellml::Units>::operator=
                ((shared_ptr<libcellml::Units> *)&stack0xfffffffffffffeb0,
                 (shared_ptr<libcellml::Units> *)
                 &requiredUnits_1.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)
                 &requiredUnits_1.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      referencedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)local_178,model,(UnitsPtr *)&stack0xfffffffffffffeb0);
      local_188._M_current =
           (shared_ptr<libcellml::Units> *)
           std::
           vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ::end(__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
      ::__normal_iterator<std::shared_ptr<libcellml::Units>*>
                ((__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
                  *)&local_180,&local_188);
      iVar6 = std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)local_178);
      iVar7 = std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     *)local_178);
      std::
      vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>::
      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,void>
                ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                  *)__return_storage_ptr__,local_180,
                 (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                  )iVar6._M_current,
                 (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                  )iVar7._M_current);
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                 *)local_178);
    }
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    push_back(__return_storage_ptr__,(value_type *)&stack0xfffffffffffffeb0);
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)&stack0xfffffffffffffeb0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ComponentEntity::componentCount(&peVar2->super_ComponentEntity);
    if (p_Var8 <= childComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi) break;
    peVar2 = std::
             __shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
    ComponentEntity::component
              ((ComponentEntity *)
               &childUsedUnits.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t)peVar2);
    std::shared_ptr<libcellml::Component_const>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::Component_const> *)&local_1e0,
               (shared_ptr<libcellml::Component> *)
               &childUsedUnits.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    unitsUsed((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
               *)local_1d0,model,(ComponentConstPtr *)&local_1e0);
    std::shared_ptr<const_libcellml::Component>::~shared_ptr(&local_1e0);
    local_1f0._M_current =
         (shared_ptr<libcellml::Units> *)
         std::
         vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Units>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>
                *)&local_1e8,&local_1f0);
    iVar6 = std::
            vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     *)local_1d0);
    iVar7 = std::
            vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   *)local_1d0);
    std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,void>
              ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                *)__return_storage_ptr__,local_1e8,
               (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                )iVar6._M_current,
               (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                )iVar7._M_current);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)local_1d0);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)
               &childUsedUnits.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(childComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<UnitsPtr> unitsUsed(const ModelPtr &model, const ComponentConstPtr &component)
{
    std::vector<UnitsPtr> usedUnits;

    // Get all the units used by variables in this component.

    for (size_t i = 0; i < component->variableCount(); ++i) {
        auto v = component->variable(i);
        auto u = v->units();
        if ((u != nullptr) && !isStandardUnitName(u->name()) && (model != nullptr)) {
            auto modelUnits = model->units(u->name());
            auto availableUnits = modelUnits ? modelUnits : u;
            auto requiredUnits = referencedUnits(model, availableUnits);
            usedUnits.insert(usedUnits.end(), requiredUnits.begin(), requiredUnits.end());
            usedUnits.push_back(availableUnits);
        } else if (model == nullptr) {
            usedUnits.push_back(u);
        }
    }

    // Get all the units used by cn elements in the components maths.

    auto componentCnUnitsNames = findComponentCnUnitsNames(component);
    for (const auto &unitsName : componentCnUnitsNames) {
        auto u = model->units(unitsName);
        if (u == nullptr) {
            // We have used a units in the math but it is not defined in the given model, so send back a units that isn't defined.
            u = Units::create(unitsName);
        } else {
            auto requiredUnits = referencedUnits(model, u);
            usedUnits.insert(usedUnits.end(), requiredUnits.begin(), requiredUnits.end());
        }
        usedUnits.push_back(u);
    }

    // Get all the units used by child components of this component.

    for (size_t i = 0; i < component->componentCount(); ++i) {
        auto childComponent = component->component(i);
        auto childUsedUnits = unitsUsed(model, childComponent);
        usedUnits.insert(usedUnits.end(), childUsedUnits.begin(), childUsedUnits.end());
    }

    return usedUnits;
}